

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprogressbar.cpp
# Opt level: O2

void __thiscall QProgressBarPrivate::resetLayoutItemMargins(QProgressBarPrivate *this)

{
  long lVar1;
  long *plVar2;
  long in_FS_OFFSET;
  QStyleOptionProgressBar option;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  plVar2 = *(long **)&(this->super_QWidgetPrivate).field_0x8;
  option.text.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  option._104_8_ = &DAT_aaaaaaaaaaaaaaaa;
  option.text.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  option.text.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  option._64_8_ = &DAT_aaaaaaaaaaaaaaaa;
  option._72_8_ = &DAT_aaaaaaaaaaaaaaaa;
  option.super_QStyleOption.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  option.super_QStyleOption.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  option.super_QStyleOption._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
  option.super_QStyleOption.palette.d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  option.super_QStyleOption.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  option.super_QStyleOption.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  option.super_QStyleOption._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  option.super_QStyleOption._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOptionProgressBar::QStyleOptionProgressBar(&option);
  (**(code **)(*plVar2 + 0x1a8))(plVar2,&option);
  QWidgetPrivate::setLayoutItemMargins
            (&this->super_QWidgetPrivate,SE_ProgressBarLayoutItem,&option.super_QStyleOption);
  QStyleOptionProgressBar::~QStyleOptionProgressBar(&option);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QProgressBarPrivate::resetLayoutItemMargins()
{
    Q_Q(QProgressBar);
    QStyleOptionProgressBar option;
    // ### It seems like this can be called directly from the constructor which should be avoided
    // ### if possible, since we will not call a possible re-implemented version
    q->initStyleOption(&option);
    setLayoutItemMargins(QStyle::SE_ProgressBarLayoutItem, &option);
}